

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int __thiscall MatroskaDemuxer::ebml_read_skip(MatroskaDemuxer *this)

{
  int iVar1;
  int64_t length;
  uint32_t id;
  uint64_t local_18;
  uint32_t local_c;
  
  iVar1 = ebml_read_element_id(this,&local_c,(int *)0x0);
  if (-1 < iVar1) {
    this->peek_id = 0;
    iVar1 = ebml_read_num(this,8,(int64_t *)&local_18);
    if (-1 < iVar1) {
      IOContextDemuxer::skip_bytes(&this->super_IOContextDemuxer,local_18);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::ebml_read_skip()
{
    uint32_t id;
    int64_t length;
    int res;

    if ((res = ebml_read_element_id(&id, nullptr)) < 0 || (res = ebml_read_element_length(&length)) < 0)
        return res;
    skip_bytes(length);
    return 0;
}